

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineInterface.cpp
# Opt level: O0

void __thiscall
supermap::cli::CommandLineInterface::CommandLineInterface(CommandLineInterface *this,string *name)

{
  string *in_RSI;
  CommandLineInterface *in_RDI;
  shared_ptr<supermap::cli::CommandLineInterface::HelpHandler> *in_stack_ffffffffffffff18;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> *in_stack_ffffffffffffff20;
  shared_ptr<supermap::cli::CommandLineInterface::Handler> *this_00;
  string *command;
  CommandLineInterface *this_01;
  CommandLineInterface *__args;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  element_type *in_stack_ffffffffffffff60;
  undefined1 local_89 [49];
  string local_58;
  undefined1 local_31 [49];
  
  this_01 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<supermap::cli::CommandLineInterface::Handler>_>_>_>
                   *)0x142494);
  in_RDI->running_ = false;
  __args = (CommandLineInterface *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::
  make_shared<supermap::cli::CommandLineInterface::HelpHandler,supermap::cli::CommandLineInterface&>
            (__args);
  command = &local_58;
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::CommandLineInterface::HelpHandler,void>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  addCommand(this_01,command,in_stack_ffffffffffffff20);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x14251e);
  std::shared_ptr<supermap::cli::CommandLineInterface::HelpHandler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::HelpHandler> *)0x14252b);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  this_00 = (shared_ptr<supermap::cli::CommandLineInterface::Handler> *)local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::
  make_shared<supermap::cli::CommandLineInterface::StopHandler,supermap::cli::CommandLineInterface&>
            (__args);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::
  shared_ptr<supermap::cli::CommandLineInterface::StopHandler,void>
            (this_00,(shared_ptr<supermap::cli::CommandLineInterface::StopHandler> *)
                     &stack0xffffffffffffff60);
  addCommand(this_01,command,this_00);
  std::shared_ptr<supermap::cli::CommandLineInterface::Handler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::Handler> *)0x1425af);
  std::shared_ptr<supermap::cli::CommandLineInterface::StopHandler>::~shared_ptr
            ((shared_ptr<supermap::cli::CommandLineInterface::StopHandler> *)0x1425b9);
  std::__cxx11::string::~string((string *)(local_89 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_89);
  return;
}

Assistant:

CommandLineInterface::CommandLineInterface(std::string name)
    : name_(std::move(name)) {
    addCommand("help", std::make_shared<HelpHandler>(*this));
    addCommand("stop", std::make_shared<StopHandler>(*this));
}